

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::IsFrozen
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar4;
  SimpleDictionaryPropertyDescriptor<int> *pSVar5;
  ArrayObject *pAVar6;
  TypedArrayBase *typedArray;
  ArrayObject *objectArray;
  int index;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  BYTE flags;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this_local;
  
  bVar1 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  if ((bVar1 & 0x80) == 0) {
    bVar1 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
    if ((bVar1 & 1) == 0) {
      objectArray._4_4_ = 0;
      while( true ) {
        pBVar4 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        iVar3 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::Count(pBVar4);
        if (iVar3 <= objectArray._4_4_) break;
        pBVar4 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>_>
                 ::operator->(&this->propertyMap);
        pSVar5 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(pBVar4,objectArray._4_4_);
        if (((pSVar5->Attributes & 8) == 0) && ((pSVar5->Attributes & 0x10) == 0)) {
          if ((pSVar5->Attributes & 2) != 0) {
            return 0;
          }
          if ((pSVar5->Attributes & 4) != 0) {
            return 0;
          }
        }
        objectArray._4_4_ = objectArray._4_4_ + 1;
      }
      pAVar6 = DynamicObject::GetObjectArray(instance);
      if ((pAVar6 == (ArrayObject *)0x0) ||
         (iVar3 = (*(pAVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])(), iVar3 != 0))
      {
        bVar2 = DynamicObject::IsAnyTypedArray(instance);
        if ((bVar2) &&
           (iVar3 = (*(instance->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])(), iVar3 == 0
           )) {
          this_local._4_4_ = 0;
        }
        else {
          DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,0xc0);
          this_local._4_4_ = 1;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsFrozen(DynamicObject* instance)
    {
        if (!IsNotExtensibleSupported)
        {
            return false;
        }

        BYTE flags = this->GetFlags();
        if (flags & IsFrozenOnceFlag)
        {
            // Once frozen, there is no way to undo freeze.
            // But note: still, it can also be frozen when the flag is not set.
            return true;
        }

        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // [[Configurable]] and [[Configurable]] must be false for all (existing) properties.
                // IE9 compatibility: keep IE9 behavior (also check deleted properties)
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    return false;
                }

                if (descriptor->Attributes & PropertyWritable)
                {
                    return false;
                }
            }
        }

        // Use IsObjectArrayFrozen() to skip "length" [[Writable]] check
        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsObjectArrayFrozen())
        {
            return false;
        }

        if (DynamicObject::IsAnyTypedArray(instance))
        {
            auto typedArray = static_cast<TypedArrayBase*>(instance);
            if (!typedArray->IsObjectArrayFrozen())
            {
                return false;
            }
        }

        // Since we've determined that the object was frozen, set the flag to avoid further checks into all properties
        // (once frozen there is no way to go back to un-frozen).
        this->SetFlags(IsSealedOnceFlag | IsFrozenOnceFlag);

        return true;
    }